

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cc
# Opt level: O1

bool __thiscall tchecker::zg::zone_t::operator<=(zone_t *this,zone_t *zone)

{
  bool bVar1;
  
  if (this->_dim == zone->_dim) {
    bVar1 = tchecker::dbm::is_empty_0((db_t *)(this + 1),this->_dim);
    if (bVar1) {
      return true;
    }
    bVar1 = tchecker::dbm::is_empty_0((db_t *)(zone + 1),zone->_dim);
    if (!bVar1) {
      bVar1 = tchecker::dbm::is_le((db_t *)(this + 1),(db_t *)(zone + 1),this->_dim);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool zone_t::operator<=(tchecker::zg::zone_t const & zone) const
{
  if (_dim != zone._dim)
    return false;
  if (this->is_empty())
    return true;
  if (zone.is_empty())
    return false;
  return tchecker::dbm::is_le(dbm_ptr(), zone.dbm_ptr(), _dim);
}